

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_head.h
# Opt level: O0

void anon_unknown.dwarf_581b4::buildAndAssert_Elements_Multiple(int elements)

{
  undefined4 local_10;
  uint run;
  int elements_local;
  
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    buildAndAssert_Elements(elements);
  }
  return;
}

Assistant:

static void buildAndAssert_Elements_Multiple(int elements) {
        for (unsigned int run = 0; run < RUNS; run++) {
            buildAndAssert_Elements(elements);
        }
    }